

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::DebugStringWithOptions_abi_cxx11_
          (FieldDescriptor *this,DebugStringOptions *debug_string_options)

{
  bool bVar1;
  Descriptor *this_00;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  SubstituteArg *in_stack_00000008;
  SubstituteArg *in_stack_00000010;
  SubstituteArg *in_stack_00000018;
  SubstituteArg *in_stack_00000020;
  char *in_stack_00000028;
  string *in_stack_00000030;
  SubstituteArg *in_stack_00000040;
  SubstituteArg *in_stack_00000048;
  SubstituteArg *in_stack_00000050;
  SubstituteArg *in_stack_00000058;
  SubstituteArg *in_stack_00000060;
  SubstituteArg *in_stack_00000068;
  int depth;
  string *contents;
  DebugStringOptions *in_stack_00000628;
  string *in_stack_00000630;
  PrintLabelFlag in_stack_00000638;
  int in_stack_0000063c;
  FieldDescriptor *in_stack_00000640;
  string *in_stack_fffffffffffffd88;
  SubstituteArg *in_stack_fffffffffffffd90;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90 [2];
  undefined4 local_20;
  undefined1 local_19;
  
  local_19 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  local_20 = 0;
  bVar1 = is_extension(in_RSI);
  if (bVar1) {
    this_00 = containing_type(in_RSI);
    Descriptor::full_name_abi_cxx11_(this_00);
    strings::internal::SubstituteArg::SubstituteArg
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    strings::internal::SubstituteArg::SubstituteArg(local_90);
    strings::internal::SubstituteArg::SubstituteArg(&local_c0);
    strings::internal::SubstituteArg::SubstituteArg(&local_f0);
    strings::internal::SubstituteArg::SubstituteArg(&local_120);
    strings::internal::SubstituteArg::SubstituteArg(&local_150);
    strings::internal::SubstituteArg::SubstituteArg(&local_180);
    strings::internal::SubstituteArg::SubstituteArg(&local_1b0);
    strings::internal::SubstituteArg::SubstituteArg(&local_1e0);
    strings::internal::SubstituteArg::SubstituteArg(&local_210);
    strings::SubstituteAndAppend
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
               in_stack_00000010,in_stack_00000008,in_stack_00000040,in_stack_00000048,
               in_stack_00000050,in_stack_00000058,in_stack_00000060,in_stack_00000068);
    local_20 = 1;
  }
  DebugString(in_stack_00000640,in_stack_0000063c,in_stack_00000638,in_stack_00000630,
              in_stack_00000628);
  bVar1 = is_extension(in_RSI);
  if (bVar1) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string FieldDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  std::string contents;
  int depth = 0;
  if (is_extension()) {
    strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                 containing_type()->full_name());
    depth = 1;
  }
  DebugString(depth, PRINT_LABEL, &contents, debug_string_options);
  if (is_extension()) {
    contents.append("}\n");
  }
  return contents;
}